

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O1

void __thiscall QPDF::JSONReactor::error(JSONReactor *this,qpdf_offset_t offset,string *msg)

{
  pointer pcVar1;
  size_t __n;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool bVar3;
  string object;
  string local_70;
  string local_50;
  
  this->errors = true;
  pcVar1 = (this->cur_object)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->cur_object)._M_string_length);
  iVar2 = (*((this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_InputSource[3])();
  getFilename_abi_cxx11_(&local_70,this->pdf);
  __n = ((undefined8 *)CONCAT44(extraout_var,iVar2))[1];
  bVar3 = true;
  if (__n == local_70._M_string_length) {
    if (__n == 0) {
      bVar3 = false;
    }
    else {
      iVar2 = bcmp(*(void **)CONCAT44(extraout_var,iVar2),local_70._M_dataplus._M_p,__n);
      bVar3 = iVar2 != 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    iVar2 = (*((this->is).super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_InputSource[3])();
    std::operator+(&local_70," from ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar2));
    std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_70._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  warn(this->pdf,qpdf_e_json,&local_50,offset,msg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
QPDF::JSONReactor::error(qpdf_offset_t offset, std::string const& msg)
{
    errors = true;
    std::string object = this->cur_object;
    if (is->getName() != pdf.getFilename()) {
        object += " from " + is->getName();
    }
    pdf.warn(qpdf_e_json, object, offset, msg);
}